

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QString::fromLocal8Bit(QByteArrayView ba)

{
  QByteArrayView ba_00;
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringDecoder toUtf16;
  undefined4 in_stack_ffffffffffffff18;
  Flag in_stack_ffffffffffffff1c;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff20;
  EncodedData<QByteArrayView> *this;
  undefined4 in_stack_ffffffffffffff28;
  QFlagsStorage<QStringConverterBase::Flag> in_stack_ffffffffffffff2c;
  char16_t local_70 [12];
  QByteArrayView local_58;
  EncodedData<QByteArrayView> local_48;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArrayView::isNull(&local_58);
  if (bVar1) {
    QString((QString *)0x5137db);
  }
  else {
    bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x5137ed);
    if (bVar1) {
      QArrayDataPointer<char16_t>::fromRawData(local_70,(qsizetype)in_stack_ffffffffffffff20);
      QString((QString *)in_stack_ffffffffffffff20,
              (DataPointer *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffff20);
    }
    else {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_48.data.m_data = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48.decoder = (QStringDecoder *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.data.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QFlags<QStringConverterBase::Flag>::QFlags
                ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff1c);
      this = &local_48;
      QStringDecoder::QStringDecoder
                ((QStringDecoder *)this,in_stack_ffffffffffffff1c,(Flags)in_stack_ffffffffffffff2c.i
                );
      ba_00.m_data._0_4_ = in_stack_ffffffffffffff28;
      ba_00.m_size = (qsizetype)this;
      ba_00.m_data._4_4_ =
           (QFlagsStorage<QStringConverterBase::Flag>)
           (QFlagsStorage<QStringConverterBase::Flag>)in_stack_ffffffffffffff2c.i;
      QStringDecoder::operator()
                ((QStringDecoder *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 ba_00);
      QStringDecoder::EncodedData::operator_cast_to_QString(this);
      QStringDecoder::~QStringDecoder((QStringDecoder *)0x5138ef);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::fromLocal8Bit(QByteArrayView ba)
{
    if (ba.isNull())
        return QString();
    if (ba.isEmpty())
        return QString(DataPointer::fromRawData(&_empty, 0));
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    return toUtf16(ba);
}